

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uts2-lace.c
# Opt level: O1

int main(int argc,char **argv)

{
  counter_t maxDepth;
  undefined8 nNodes;
  double dVar1;
  double dVar2;
  Node root;
  int local_7c;
  Node local_78;
  undefined1 local_58 [32];
  counter_t local_38;
  
  local_7c = argc;
  lace_parseParams(&local_7c,argv);
  uts_parseParams(local_7c,argv);
  uts_printParams();
  uts_initRoot(&local_78,type);
  lace_start(_lace_workers,(long)_lace_dqsize);
  printf("Initialized Lace with %d workers, dqsize=%d\n",(ulong)(uint)_lace_workers,
         (ulong)(uint)_lace_dqsize);
  dVar1 = uts_wctime();
  local_58._0_8_ = parTreeSearch_WRAP;
  local_58._8_8_ = (_Worker *)0x1;
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58._24_8_ = &local_78;
  lace_run_task((Task *)local_58);
  nNodes = local_58._24_8_;
  maxDepth = CONCAT44(local_58._20_4_,local_58._16_4_);
  dVar2 = uts_wctime();
  ::nNodes = nNodes;
  nLeaves = local_38;
  maxTreeDepth = maxDepth;
  uts_showStats(1,0,dVar2 - dVar1,nNodes,local_38,maxDepth);
  printf("Time: %f\n",dVar2 - dVar1);
  lace_stop();
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
  Node root;
  double t1, t2;

  lace_parseParams(&argc, argv);
  uts_parseParams(argc, argv);

  uts_printParams();
  uts_initRoot(&root, type);
  
  lace_start(_lace_workers, _lace_dqsize);

  printf("Initialized Lace with %d workers, dqsize=%d\n", _lace_workers, _lace_dqsize);

  t1 = uts_wctime();
  Result r = RUN(parTreeSearch, 0, &root);
  t2 = uts_wctime();

  maxTreeDepth = r.maxdepth;
  nNodes  = r.size;
  nLeaves = r.leaves;

  uts_showStats(GET_NUM_THREADS, 0, t2-t1, nNodes, nLeaves, maxTreeDepth);

  printf("Time: %f\n", t2-t1);

  lace_stop();

  return 0;
}